

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O1

string * SkeletalMesh::Scene::testAllSuffix(string *__return_storage_ptr__,string *no_suffix_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  FILE *__stream;
  long lVar3;
  long *plVar4;
  string support_suffix [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,".obj","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,".dae","");
  plVar4 = local_48;
  local_58[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,".fbx","");
  paVar1 = &__return_storage_ptr__->field_2;
  lVar3 = 0;
  do {
    std::operator+(__return_storage_ptr__,no_suffix_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&local_98._M_dataplus._M_p + lVar3));
    __stream = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"r");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      goto LAB_00131e9f;
    }
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00131e9f:
  lVar3 = -0x60;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  return __return_storage_ptr__;
}

Assistant:

static std::string testAllSuffix(std::string no_suffix_name) {
            const int support_suffix_num = 3;
            const std::string support_suffix[support_suffix_num] = {
                    ".obj",
                    ".dae",
                    ".fbx"
            };

            for (int i = 0; i < support_suffix_num; i++) {
                std::string try_filename = no_suffix_name + support_suffix[i];
                FILE *ftest = fopen(try_filename.c_str(), "r");
                if (ftest) {
                    fclose(ftest);
                    return try_filename;
                }
            }
            return std::string();
        }